

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

ptr<resp_msg> __thiscall nuraft::raft_server::handle_reconnect_req(raft_server *this,req_msg *req)

{
  timer_helper *this_00;
  undefined4 uVar1;
  _func_int *p_Var2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _func_int **pp_Var4;
  pointer psVar5;
  int iVar6;
  element_type *peVar7;
  iterator iVar8;
  long in_RDX;
  undefined **ppuVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  undefined1 auVar10 [16];
  ptr<resp_msg> pVar11;
  int32 srv_id;
  uint local_4c;
  string local_48;
  
  local_4c = *(uint *)(in_RDX + 0x14);
  p_Var2 = req[9].super_msg_base._vptr_msg_base[1];
  peVar7 = (element_type *)operator_new(0xb0);
  (peVar7->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar7->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_001cf278;
  uVar1 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar7->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var2;
  *(undefined4 *)&(peVar7->bg_append_thread_)._M_id._M_thread = 0x1b;
  *(undefined4 *)((long)&(peVar7->bg_append_thread_)._M_id._M_thread + 4) = uVar1;
  *(uint *)&peVar7->bg_append_ea_ = local_4c;
  ppuVar9 = &PTR__resp_msg_001cf2c8;
  (peVar7->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_001cf2c8;
  (peVar7->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar7->priority_change_timer_).duration_us_ = 0;
  *(undefined8 *)&(peVar7->priority_change_timer_).first_event_fired_ = 0;
  (peVar7->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(peVar7->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(peVar7->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)((long)&(peVar7->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar7->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  peVar7->votes_responded_ = 0;
  peVar7->votes_granted_ = 0;
  (peVar7->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar7->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar7->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&(peVar7->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar7->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar7->field_0x31 = 0;
  peVar7->leader_ = (__atomic_base<int>)0x0;
  peVar7->id_ = 0;
  peVar7->my_priority_ = 0;
  *(undefined1 *)&peVar7->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar7->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (*(int *)&req[8].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
    iVar8 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(req + 6),(key_type_conflict *)&local_4c);
    if (iVar8.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      lVar3 = *(long *)((long)iVar8.
                              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                              ._M_cur + 0x10);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x18);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      this_00 = (timer_helper *)(lVar3 + 0x1e8);
      timer_helper::set_duration_us(this_00,3000000);
      timer_helper::reset(this_00);
      LOCK();
      *(undefined1 *)(lVar3 + 0x1e5) = 1;
      UNLOCK();
      pp_Var4 = this->_vptr_raft_server;
      auVar10 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      ppuVar9 = auVar10._8_8_;
      pp_Var4[4] = auVar10._0_8_;
      *(undefined1 *)(pp_Var4 + 6) = 1;
      psVar5 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar5 != (pointer)0x0) {
        iVar6 = (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
        ppuVar9 = (undefined **)extraout_RDX_05;
        if (3 < iVar6) {
          psVar5 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_(&local_48,"re-connection to peer %d scheduled",(ulong)local_4c);
          (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar5,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_reconnect_req",0x3b7,&local_48);
          ppuVar9 = (undefined **)extraout_RDX_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
            ppuVar9 = (undefined **)extraout_RDX_07;
          }
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        ppuVar9 = (undefined **)extraout_RDX_08;
      }
      goto LAB_0019aace;
    }
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppuVar9 = (undefined **)extraout_RDX;
    if (psVar5 == (pointer)0x0) goto LAB_0019aace;
    iVar6 = (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    ppuVar9 = (undefined **)extraout_RDX_02;
    if (iVar6 < 2) goto LAB_0019aace;
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_48,"cannot find peer %d to re-connect",(ulong)local_4c);
    (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar5,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
      ,"handle_reconnect_req",0x3af,&local_48);
    ppuVar9 = (undefined **)extraout_RDX_03;
  }
  else {
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar5 == (pointer)0x0) goto LAB_0019aace;
    iVar6 = (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    ppuVar9 = (undefined **)extraout_RDX_00;
    if (iVar6 < 2) goto LAB_0019aace;
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_48,"this node is not a leader (upon re-connect req from peer %d)",
               (ulong)local_4c);
    (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar5,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
      ,"handle_reconnect_req",0x3a9,&local_48);
    ppuVar9 = (undefined **)extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
    ppuVar9 = (undefined **)extraout_RDX_04;
  }
LAB_0019aace:
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar9;
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_reconnect_req(req_msg& req) {
    int32 srv_id = req.get_src();
    ptr<resp_msg> resp( cs_new<resp_msg>
                        ( state_->get_term(),
                          msg_type::reconnect_response,
                          id_,
                          srv_id ) );
    if (role_ != srv_role::leader) {
        p_er("this node is not a leader "
             "(upon re-connect req from peer %d)",
             srv_id);
        return resp;
    }

    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) {
        p_er("cannot find peer %d to re-connect", srv_id);
        return resp;
    }

    // Schedule re-connection.
    ptr<peer> pp = entry->second;
    pp->schedule_reconnection();
    resp->accept(log_store_->next_slot());
    p_in("re-connection to peer %d scheduled", srv_id);

    return resp;
}